

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O0

double calculator::ExpressionParser<__int128>::pow(double __x,double __y)

{
  long lVar1;
  long in_RCX;
  long lVar2;
  ulong in_RDX;
  ulong uVar3;
  bool bVar4;
  __int128 res;
  __int128 n_local;
  __int128 x_local;
  
  n_local._8_8_ = in_RCX;
  for (n_local._0_8_ = in_RDX; (long)(ulong)((ulong)n_local == 0) <= n_local._8_8_;
      n_local._0_8_ = lVar2 << 0x3f | (ulong)n_local + -lVar1 >> 1) {
    uVar3 = (ulong)n_local + -(n_local._8_8_ >> 0x3f) & 0xfffffffffffffffe;
    if ((ulong)n_local != uVar3 ||
        -(ulong)CARRY8((ulong)n_local,-(n_local._8_8_ >> 0x3f)) != (ulong)((ulong)n_local < uVar3))
    {
      bVar4 = (ulong)n_local != 0;
      n_local._0_8_ = (ulong)n_local - 1;
      n_local._8_8_ = n_local._8_8_ + -1 + (ulong)bVar4;
    }
    lVar1 = n_local._8_8_ >> 0x3f;
    lVar2 = n_local._8_8_ + (ulong)CARRY8((ulong)n_local,-lVar1);
    n_local._8_8_ = lVar2 >> 1;
  }
  return __x;
}

Assistant:

static T pow(T x, T n)
  {
    T res = 1;

    while (n > 0)
    {
      if (n % 2 != 0)
      {
        res *= x;
        n -= 1;
      }
      n /= 2;

      if (n > 0)
        x *= x;
    }

    return res;
  }